

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_4ec2e9::BNTest_ASC2BN_Test::TestBody(BNTest_ASC2BN_Test *this)

{
  internal iVar1;
  _Head_base<0UL,_bignum_st_*,_false> _Var2;
  int iVar3;
  pointer __p;
  BIGNUM *pBVar4;
  char *in_R9;
  bool bVar5;
  BIGNUM *raw;
  UniquePtr<BIGNUM> bn;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  _Head_base<0UL,_bignum_st_*,_false> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined1 local_38 [32];
  _Head_base<0UL,_bignum_st_*,_false> local_18;
  
  local_38._0_8_ = (BIGNUM *)0x0;
  iVar3 = BN_asc2bn((BIGNUM **)local_38,"0");
  local_18._M_head_impl = (bignum_st *)(BIGNUM *)0x0;
  if (iVar3 != 0) {
    local_18._M_head_impl = (bignum_st *)local_38._0_8_;
  }
  iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48._M_head_impl._0_1_ = iVar1;
  if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x4ba,(char *)local_38._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
  }
  else {
    iVar3 = BN_is_zero(local_18._M_head_impl);
    local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_48._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_38,(internal *)&local_48,(AssertionResult *)"BN_is_zero(bn.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bb,(char *)local_38._0_8_);
      testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&AStack_58);
      if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
        operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
      }
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
    }
    iVar3 = BN_is_negative(local_18._M_head_impl);
    local_48._M_head_impl._0_1_ = (internal)(iVar3 == 0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 != 0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c51b,"true","false"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bc,(char *)local_38._0_8_);
      testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&AStack_58);
      if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
        operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
      }
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
    }
    local_38._0_8_ = (BIGNUM *)0x0;
    iVar3 = BN_asc2bn((BIGNUM **)local_38,"256");
    _Var2._M_head_impl = local_18._M_head_impl;
    pBVar4 = (BIGNUM *)0x0;
    if (iVar3 != 0) {
      pBVar4 = (BIGNUM *)local_38._0_8_;
    }
    local_48._M_head_impl = (bignum_st *)0x0;
    bVar5 = (BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0;
    local_18._M_head_impl = (bignum_st *)pBVar4;
    if (bVar5) {
      BN_free((BIGNUM *)_Var2._M_head_impl);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
    iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_48._M_head_impl._0_1_ = iVar1;
    if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bf,(char *)local_38._0_8_);
      testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    }
    else {
      iVar3 = BN_is_word(local_18._M_head_impl,0x100);
      local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_48._M_head_impl._0_1_) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_38,(internal *)&local_48,
                   (AssertionResult *)"BN_is_word(bn.get(), 256)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c0,(char *)local_38._0_8_);
        testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&AStack_58);
        if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
          operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
        }
        if (local_50._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_50._M_head_impl + 8))();
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
      }
      iVar3 = BN_is_negative(local_18._M_head_impl);
      local_48._M_head_impl._0_1_ = (internal)(iVar3 == 0);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 != 0) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c51b,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c1,(char *)local_38._0_8_);
        testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&AStack_58);
        if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
          operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
        }
        if (local_50._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_50._M_head_impl + 8))();
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
      }
      local_38._0_8_ = (BIGNUM *)0x0;
      iVar3 = BN_asc2bn((BIGNUM **)local_38,"-42");
      _Var2._M_head_impl = local_18._M_head_impl;
      pBVar4 = (BIGNUM *)0x0;
      if (iVar3 != 0) {
        pBVar4 = (BIGNUM *)local_38._0_8_;
      }
      local_48._M_head_impl = (bignum_st *)0x0;
      bVar5 = (BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0;
      local_18._M_head_impl = (bignum_st *)pBVar4;
      if (bVar5) {
        BN_free((BIGNUM *)_Var2._M_head_impl);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
      iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_48._M_head_impl._0_1_ = iVar1;
      if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c4,(char *)local_38._0_8_);
        testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
      }
      else {
        iVar3 = BN_abs_is_word(local_18._M_head_impl,0x2a);
        local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_48._M_head_impl._0_1_) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_38,(internal *)&local_48,
                     (AssertionResult *)"BN_abs_is_word(bn.get(), 42)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c5,(char *)local_38._0_8_);
          testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&AStack_58);
          if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
            operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
          }
          if (local_50._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_50._M_head_impl + 8))();
          }
          if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_40,local_40);
          }
        }
        iVar3 = BN_is_negative(local_18._M_head_impl);
        local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c51b,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c6,(char *)local_38._0_8_);
          testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&AStack_58);
          if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
            operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
          }
          if (local_50._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_50._M_head_impl + 8))();
          }
          if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_40,local_40);
          }
        }
        local_38._0_8_ = (BIGNUM *)0x0;
        iVar3 = BN_asc2bn((BIGNUM **)local_38,"0x1234");
        _Var2._M_head_impl = local_18._M_head_impl;
        pBVar4 = (BIGNUM *)0x0;
        if (iVar3 != 0) {
          pBVar4 = (BIGNUM *)local_38._0_8_;
        }
        local_48._M_head_impl = (bignum_st *)0x0;
        bVar5 = (BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0;
        local_18._M_head_impl = (bignum_st *)pBVar4;
        if (bVar5) {
          BN_free((BIGNUM *)_Var2._M_head_impl);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
        iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_48._M_head_impl._0_1_ = iVar1;
        if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c9,(char *)local_38._0_8_);
          testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
        }
        else {
          iVar3 = BN_is_word(local_18._M_head_impl,0x1234);
          local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_48._M_head_impl._0_1_) {
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_38,(internal *)&local_48,
                       (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ca,(char *)local_38._0_8_);
            testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&AStack_58);
            if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
              operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
            }
            if (local_50._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_50._M_head_impl + 8))();
            }
            if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_40,local_40);
            }
          }
          iVar3 = BN_is_negative(local_18._M_head_impl);
          local_48._M_head_impl._0_1_ = (internal)(iVar3 == 0);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 != 0) {
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c51b,"true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4cb,(char *)local_38._0_8_);
            testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&AStack_58);
            if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
              operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
            }
            if (local_50._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_50._M_head_impl + 8))();
            }
            if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_40,local_40);
            }
          }
          local_38._0_8_ = (BIGNUM *)0x0;
          iVar3 = BN_asc2bn((BIGNUM **)local_38,"0X1234");
          _Var2._M_head_impl = local_18._M_head_impl;
          pBVar4 = (BIGNUM *)0x0;
          if (iVar3 != 0) {
            pBVar4 = (BIGNUM *)local_38._0_8_;
          }
          local_48._M_head_impl = (bignum_st *)0x0;
          bVar5 = (BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0;
          local_18._M_head_impl = (bignum_st *)pBVar4;
          if (bVar5) {
            BN_free((BIGNUM *)_Var2._M_head_impl);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
          iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_48._M_head_impl._0_1_ = iVar1;
          if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ce,(char *)local_38._0_8_);
            testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
          }
          else {
            iVar3 = BN_is_word(local_18._M_head_impl,0x1234);
            local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
            local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_48._M_head_impl._0_1_) {
              testing::Message::Message((Message *)&local_50);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_38,(internal *)&local_48,
                         (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4cf,(char *)local_38._0_8_);
              testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
              testing::internal::AssertHelper::~AssertHelper(&AStack_58);
              if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
                operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
              }
              if (local_50._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_50._M_head_impl + 8))();
              }
              if (local_40 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_40,local_40);
              }
            }
            iVar3 = BN_is_negative(local_18._M_head_impl);
            local_48._M_head_impl._0_1_ = (internal)(iVar3 == 0);
            local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar3 != 0) {
              testing::Message::Message((Message *)&local_50);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c51b,"true"
                         ,"false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d0,(char *)local_38._0_8_);
              testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
              testing::internal::AssertHelper::~AssertHelper(&AStack_58);
              if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
                operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
              }
              if (local_50._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_50._M_head_impl + 8))();
              }
              if (local_40 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_40,local_40);
              }
            }
            local_38._0_8_ = (BIGNUM *)0x0;
            iVar3 = BN_asc2bn((BIGNUM **)local_38,"-0xabcd");
            _Var2._M_head_impl = local_18._M_head_impl;
            pBVar4 = (BIGNUM *)0x0;
            if (iVar3 != 0) {
              pBVar4 = (BIGNUM *)local_38._0_8_;
            }
            local_48._M_head_impl = (bignum_st *)0x0;
            bVar5 = (BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0;
            local_18._M_head_impl = (bignum_st *)pBVar4;
            if (bVar5) {
              BN_free((BIGNUM *)_Var2._M_head_impl);
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
            iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
            local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_48._M_head_impl._0_1_ = iVar1;
            if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
              testing::Message::Message((Message *)&local_50);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d3,(char *)local_38._0_8_);
              testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
            }
            else {
              iVar3 = BN_abs_is_word(local_18._M_head_impl,0xabcd);
              local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
              local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_48._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_50);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_38,(internal *)&local_48,
                           (AssertionResult *)"BN_abs_is_word(bn.get(), 0xabcd)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_58,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d4,(char *)local_38._0_8_);
                testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
                testing::internal::AssertHelper::~AssertHelper(&AStack_58);
                if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
                  operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
                }
                if (local_50._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                }
                if (local_40 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_40,local_40);
                }
              }
              iVar3 = BN_is_negative(local_18._M_head_impl);
              local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
              local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar3 == 0) {
                testing::Message::Message((Message *)&local_50);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_38,(internal *)&local_48,
                           (AssertionResult *)"!BN_is_negative(bn.get())","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_58,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d5,(char *)local_38._0_8_);
                testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
                testing::internal::AssertHelper::~AssertHelper(&AStack_58);
                if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
                  operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
                }
                if (local_50._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_50._M_head_impl + 8))();
                }
                if (local_40 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_40,local_40);
                }
              }
              local_38._0_8_ = (BIGNUM *)0x0;
              iVar3 = BN_asc2bn((BIGNUM **)local_38,"-0");
              _Var2._M_head_impl = local_18._M_head_impl;
              pBVar4 = (BIGNUM *)0x0;
              if (iVar3 != 0) {
                pBVar4 = (BIGNUM *)local_38._0_8_;
              }
              local_48._M_head_impl = (bignum_st *)0x0;
              bVar5 = (BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0;
              local_18._M_head_impl = (bignum_st *)pBVar4;
              if (bVar5) {
                BN_free((BIGNUM *)_Var2._M_head_impl);
              }
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
              iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
              local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_48._M_head_impl._0_1_ = iVar1;
              if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
                testing::Message::Message((Message *)&local_50);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_58,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d8,(char *)local_38._0_8_);
                testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
              }
              else {
                iVar3 = BN_is_zero(local_18._M_head_impl);
                local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
                local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_48._M_head_impl._0_1_) {
                  testing::Message::Message((Message *)&local_50);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_38,(internal *)&local_48,
                             (AssertionResult *)"BN_is_zero(bn.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_58,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4d9,(char *)local_38._0_8_);
                  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
                  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
                  if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
                    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
                  }
                  if (local_50._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_50._M_head_impl + 8))();
                  }
                  if (local_40 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_40,local_40);
                  }
                }
                iVar3 = BN_is_negative(local_18._M_head_impl);
                local_48._M_head_impl._0_1_ = (internal)(iVar3 == 0);
                local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar3 != 0) {
                  testing::Message::Message((Message *)&local_50);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c51b,
                             "true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_58,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4da,(char *)local_38._0_8_);
                  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
                  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
                  if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
                    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
                  }
                  if (local_50._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_50._M_head_impl + 8))();
                  }
                  if (local_40 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_40,local_40);
                  }
                }
                local_38._0_8_ = (BIGNUM *)0x0;
                iVar3 = BN_asc2bn((BIGNUM **)local_38,"123trailing garbage is ignored");
                _Var2._M_head_impl = local_18._M_head_impl;
                pBVar4 = (BIGNUM *)0x0;
                if (iVar3 != 0) {
                  pBVar4 = (BIGNUM *)local_38._0_8_;
                }
                local_48._M_head_impl = (bignum_st *)0x0;
                bVar5 = (BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0;
                local_18._M_head_impl = (bignum_st *)pBVar4;
                if (bVar5) {
                  BN_free((BIGNUM *)_Var2._M_head_impl);
                }
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
                iVar1 = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
                local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_48._M_head_impl._0_1_ = iVar1;
                if ((BIGNUM *)local_18._M_head_impl == (BIGNUM *)0x0) {
                  testing::Message::Message((Message *)&local_50);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c60c,
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4dd,(char *)local_38._0_8_);
                  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
                }
                else {
                  iVar3 = BN_is_word(local_18._M_head_impl,0x7b);
                  local_48._M_head_impl._0_1_ = (internal)(iVar3 != 0);
                  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (!(bool)local_48._M_head_impl._0_1_) {
                    testing::Message::Message((Message *)&local_50);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_38,(internal *)&local_48,
                               (AssertionResult *)"BN_is_word(bn.get(), 123)","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&AStack_58,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x4de,(char *)local_38._0_8_);
                    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
                    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
                    if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
                      operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
                    }
                    if (local_50._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_50._M_head_impl + 8))();
                    }
                    if (local_40 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_40,local_40);
                    }
                  }
                  iVar3 = BN_is_negative(local_18._M_head_impl);
                  local_48._M_head_impl._0_1_ = (internal)(iVar3 == 0);
                  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if ((bool)local_48._M_head_impl._0_1_) goto LAB_002b0033;
                  testing::Message::Message((Message *)&local_50);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_38,(internal *)&local_48,(AssertionResult *)0x53c51b,
                             "true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&AStack_58,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4df,(char *)local_38._0_8_);
                  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if ((BIGNUM *)local_38._0_8_ != (BIGNUM *)(local_38 + 0x10)) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
LAB_002b0033:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST_F(BNTest, ASC2BN) {
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("256");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 256));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-42");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 42));
  EXPECT_TRUE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0x1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0X1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0xabcd");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 0xabcd));
  EXPECT_FALSE(!BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("123trailing garbage is ignored");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 123));
  EXPECT_FALSE(BN_is_negative(bn.get()));
}